

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall
Assimp::STEP::EXPRESS::ConversionSchema::ConversionSchema<980ul>
          (ConversionSchema *this,SchemaEntry (*schemas) [980])

{
  SchemaEntry (*schemas_local) [980];
  ConversionSchema *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  ::map(&this->converters);
  operator=(this,schemas);
  return;
}

Assistant:

explicit ConversionSchema( const SchemaEntry (& schemas)[N]) {
                *this = schemas;
            }